

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O2

size_t __thiscall
embree::FastAllocator::Block::getFreeBytes(Block *this,AllocationType atype,bool huge_pages)

{
  bool bVar1;
  size_t sVar2;
  Block *block;
  size_t sVar3;
  
  sVar3 = 0;
  for (; this != (Block *)0x0; this = this->next) {
    bVar1 = hasType(this,atype,huge_pages);
    if (bVar1) {
      sVar2 = getBlockFreeBytes(this);
      sVar3 = sVar3 + sVar2;
    }
  }
  return sVar3;
}

Assistant:

size_t getFreeBytes(AllocationType atype, bool huge_pages = false) const {
        size_t bytes = 0;
        for (const Block* block = this; block; block = block->next) {
          if (!block->hasType(atype,huge_pages)) continue;
          bytes += block->getBlockFreeBytes();
        }
        return bytes;
      }